

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O1

PartitionWriteInfo * __thiscall
duckdb::CopyToFunctionGlobalState::GetPartitionWriteInfo
          (CopyToFunctionGlobalState *this,ExecutionContext *context,PhysicalCopyToFile *op,
          vector<duckdb::Value,_true> *values)

{
  vector_of_value_map_t<unique_ptr<PartitionWriteInfo>_> *this_00;
  ClientContext *pCVar1;
  copy_to_initialize_global_t p_Var2;
  FunctionData *pFVar3;
  _Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
  _Var4;
  copy_to_get_written_statistics_t p_Var5;
  PhysicalCopyToFile *pPVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  iterator iVar10;
  pointer pPVar11;
  type pPVar12;
  mapped_type *pmVar13;
  iterator iVar14;
  FileSystem *fs;
  type l;
  string *psVar15;
  type pFVar16;
  type pGVar17;
  type pCVar18;
  const_reference pvVar19;
  const_reference __args;
  const_reference this_01;
  InternalException *this_02;
  size_type __n;
  __node_base *p_Var20;
  templated_unique_single_t info;
  optional_ptr<duckdb::CopyToFileInfo,_true> written_file_info;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> global_lock;
  vector<duckdb::Value,_true> partition_values;
  vector<duckdb::Value,_true> partition_keys;
  vector_of_value_map_t<unique_ptr<PartitionWriteInfo>_> *__range3;
  string full_path;
  string hive_path;
  string trimmed_path;
  __uniq_ptr_impl<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>_>
  local_1e8;
  optional_ptr<duckdb::CopyToFileInfo,_true> local_1e0;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *local_1d8;
  idx_t local_1d0;
  PhysicalCopyToFile *local_1c8;
  undefined1 local_1c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  pointer pVStack_1b0;
  pointer local_1a8;
  pointer local_198;
  pointer pVStack_190;
  pointer local_188;
  _Hashtable<duckdb::vector<duckdb::Value,_true>,_std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>,_std::allocator<std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>_>,_std::__detail::_Select1st,_duckdb::VectorOfValuesEquality,_duckdb::VectorOfValuesHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_180;
  undefined1 local_178 [96];
  LogicalType local_118;
  string local_100;
  LogicalType local_e0;
  string local_c8;
  string local_a8;
  string local_88;
  vector<duckdb::Value,_true> local_68;
  vector<duckdb::Value,_true> local_48;
  
  StorageLock::GetExclusiveLock((StorageLock *)local_1c0);
  this_00 = &this->active_partitioned_writes;
  local_1d8 = &values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>;
  iVar10 = ::std::
           _Hashtable<duckdb::vector<duckdb::Value,_true>,_std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>,_std::allocator<std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>_>,_std::__detail::_Select1st,_duckdb::VectorOfValuesEquality,_duckdb::VectorOfValuesHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&this_00->_M_h,values);
  if (iVar10.
      super__Node_iterator_base<std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_180 = &this_00->_M_h;
    if (this->max_open_files <= (this->active_partitioned_writes)._M_h._M_element_count) {
      p_Var20 = &(this->active_partitioned_writes)._M_h._M_before_begin;
      do {
        p_Var20 = p_Var20->_M_nxt;
        if (p_Var20 == (__node_base *)0x0) goto LAB_016f5e65;
        pPVar11 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                  ::operator->((unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                                *)(p_Var20 + 4));
      } while (pPVar11->active_writes != 0);
      pCVar1 = context->client;
      pPVar12 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                ::operator*((unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                             *)(p_Var20 + 4));
      FinalizePartition(this,pCVar1,op,pPVar12);
      pmVar13 = ::std::__detail::
                _Map_base<duckdb::vector<duckdb::Value,_true>,_std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>,_std::allocator<std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::VectorOfValuesEquality,_duckdb::VectorOfValuesHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<duckdb::vector<duckdb::Value,_true>,_std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>,_std::allocator<std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::VectorOfValuesEquality,_duckdb::VectorOfValuesHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->previous_partitions,(key_type *)(p_Var20 + 1));
      *pmVar13 = *pmVar13 + 1;
      ::std::
      _Hashtable<duckdb::vector<duckdb::Value,_true>,_std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>,_std::allocator<std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>_>,_std::__detail::_Select1st,_duckdb::VectorOfValuesEquality,_duckdb::VectorOfValuesHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(local_180,p_Var20 + 1);
    }
LAB_016f5e65:
    iVar14 = ::std::
             _Hashtable<duckdb::vector<duckdb::Value,_true>,_std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>,_std::allocator<std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::VectorOfValuesEquality,_duckdb::VectorOfValuesHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->previous_partitions)._M_h,(key_type *)local_1d8);
    if (iVar14.
        super__Node_iterator_base<std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_1d0 = 0;
    }
    else {
      local_1d0 = *(idx_t *)((long)iVar14.
                                   super__Node_iterator_base<std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>,_true>
                                   ._M_cur + 0x20);
    }
    fs = FileSystem::GetFileSystem(context->client);
    PhysicalCopyToFile::GetTrimmedPath_abi_cxx11_(&local_88,op,context->client);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    local_178._88_8_ = &op->partition_columns;
    local_178._80_8_ = &op->names;
    GetOrCreateDirectory
              (&local_a8,this,(vector<unsigned_long,_true> *)local_178._88_8_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_178._80_8_,(vector<duckdb::Value,_true> *)local_1d8,&local_c8,fs);
    local_178._64_8_ = this;
    local_178._72_8_ = context;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    FilenamePattern::CreateFilename
              (&local_100,&op->filename_pattern,fs,&local_a8,&op->file_extension,local_1d0);
    local_1c8 = op;
    if (op->overwrite_mode == COPY_APPEND) {
      while( true ) {
        iVar9 = (*fs->_vptr_FileSystem[0x12])(fs,&local_100,0);
        if ((char)iVar9 == '\0') break;
        if ((local_1c8->filename_pattern).uuid == false) {
          this_02 = (InternalException *)__cxa_allocate_exception(0x10);
          local_178._0_8_ = local_178 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_178,
                     "CopyOverwriteMode::COPY_APPEND without {uuid} - and file exists","");
          InternalException::InternalException(this_02,(string *)local_178);
          __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        FilenamePattern::CreateFilename
                  ((string *)local_178,&op->filename_pattern,fs,&local_a8,&op->file_extension,
                   local_1d0);
        ::std::__cxx11::string::operator=((string *)&local_100,(string *)local_178);
        if ((GlobalFunctionData *)local_178._0_8_ != (GlobalFunctionData *)(local_178 + 0x10)) {
          operator_delete((void *)local_178._0_8_);
        }
      }
    }
    uVar8 = local_178._72_8_;
    pPVar6 = local_1c8;
    local_1e0.ptr = (CopyToFileInfo *)0x0;
    if (local_1c8->return_type != CHANGED_ROWS) {
      l = unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::
          operator*((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                     *)local_1c0);
      local_1e0 = AddFile((CopyToFunctionGlobalState *)local_178._64_8_,l,&local_100,
                          pPVar6->return_type);
    }
    local_1e8._M_t.
    super__Tuple_impl<0UL,_duckdb::PartitionWriteInfo_*,_std::default_delete<duckdb::PartitionWriteInfo>_>
    .super__Head_base<0UL,_duckdb::PartitionWriteInfo_*,_false>._M_head_impl =
         (tuple<duckdb::PartitionWriteInfo_*,_std::default_delete<duckdb::PartitionWriteInfo>_>)
         operator_new(0x10);
    *(undefined8 *)
     local_1e8._M_t.
     super__Tuple_impl<0UL,_duckdb::PartitionWriteInfo_*,_std::default_delete<duckdb::PartitionWriteInfo>_>
     .super__Head_base<0UL,_duckdb::PartitionWriteInfo_*,_false>._M_head_impl = 0;
    *(undefined8 *)
     ((long)local_1e8._M_t.
            super__Tuple_impl<0UL,_duckdb::PartitionWriteInfo_*,_std::default_delete<duckdb::PartitionWriteInfo>_>
            .super__Head_base<0UL,_duckdb::PartitionWriteInfo_*,_false>._M_head_impl + 8) = 0;
    p_Var2 = (pPVar6->function).copy_to_initialize_global;
    pFVar3 = *(FunctionData **)uVar8;
    psVar15 = (string *)
              unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
              operator*(&pPVar6->bind_data);
    (*p_Var2)((ClientContext *)local_178,pFVar3,psVar15);
    pPVar11 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
              ::operator->((unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                            *)&local_1e8);
    uVar7 = local_178._0_8_;
    local_178._0_8_ = (GlobalFunctionData *)0x0;
    _Var4.super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl =
         (pPVar11->global_state).
         super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
         .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>;
    (pPVar11->global_state).
    super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
    .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false> =
         (_Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>)uVar7;
    if (_Var4.super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl !=
        (GlobalFunctionData *)0x0) {
      (**(code **)(*(long *)_Var4.super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>.
                            _M_head_impl + 8))();
    }
    if ((GlobalFunctionData *)local_178._0_8_ != (GlobalFunctionData *)0x0) {
      (*(*(_func_int ***)local_178._0_8_)[1])();
    }
    if (local_1e0.ptr != (CopyToFileInfo *)0x0) {
      p_Var5 = (pPVar6->function).copy_to_get_written_statistics;
      pCVar1 = *(ClientContext **)uVar8;
      pFVar16 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
                operator*(&pPVar6->bind_data);
      pPVar11 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                ::operator->((unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                              *)&local_1e8);
      pGVar17 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                ::operator*(&pPVar11->global_state);
      optional_ptr<duckdb::CopyToFileInfo,_true>::CheckValid(&local_1e0);
      pCVar18 = unique_ptr<duckdb::CopyFunctionFileStatistics,_std::default_delete<duckdb::CopyFunctionFileStatistics>,_true>
                ::operator*(&(local_1e0.ptr)->file_stats);
      (*p_Var5)(pCVar1,pFVar16,pGVar17,pCVar18);
      local_198 = (pointer)0x0;
      pVStack_190 = (pointer)0x0;
      local_188 = (pointer)0x0;
      local_1a8 = (pointer)0x0;
      local_1b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pVStack_1b0 = (pointer)0x0;
      if ((pPVar6->partition_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pPVar6->partition_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          pvVar19 = vector<unsigned_long,_true>::operator[]
                              ((vector<unsigned_long,_true> *)local_178._88_8_,__n);
          __args = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 *)local_178._80_8_,*pvVar19);
          this_01 = vector<duckdb::Value,_true>::operator[]
                              ((vector<duckdb::Value,_true> *)local_1d8,__n);
          ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_198,__args);
          LogicalType::LogicalType(&local_118,VARCHAR);
          Value::DefaultCastAs((Value *)local_178,this_01,&local_118,false);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1b8,
                     (Value *)local_178);
          Value::~Value((Value *)local_178);
          LogicalType::~LogicalType(&local_118);
          __n = __n + 1;
        } while (__n < (ulong)((long)(local_1c8->partition_columns).
                                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_1c8->partition_columns).
                                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      LogicalType::LogicalType(&local_118,VARCHAR);
      LogicalType::LogicalType(&local_e0,VARCHAR);
      local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = local_198;
      local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = pVStack_190;
      local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_188;
      local_198 = (pointer)0x0;
      pVStack_190 = (pointer)0x0;
      local_188 = (pointer)0x0;
      local_68.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1b8._M_pi;
      local_68.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = pVStack_1b0;
      local_68.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_1a8;
      local_1b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pVStack_1b0 = (pointer)0x0;
      local_1a8 = (pointer)0x0;
      Value::MAP((Value *)local_178,&local_118,&local_e0,&local_48,&local_68);
      optional_ptr<duckdb::CopyToFileInfo,_true>::CheckValid(&local_1e0);
      Value::operator=(&(local_1e0.ptr)->partition_keys,(Value *)local_178);
      Value::~Value((Value *)local_178);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_68);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_48);
      LogicalType::~LogicalType(&local_e0);
      LogicalType::~LogicalType(&local_118);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1b8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_198);
    }
    pPVar12 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
              ::operator*((unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                           *)&local_1e8);
    pPVar11 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
              ::operator->((unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                            *)&local_1e8);
    pPVar11->active_writes = 1;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_178,local_1d8);
    local_178._24_8_ =
         local_1e8._M_t.
         super__Tuple_impl<0UL,_duckdb::PartitionWriteInfo_*,_std::default_delete<duckdb::PartitionWriteInfo>_>
         .super__Head_base<0UL,_duckdb::PartitionWriteInfo_*,_false>._M_head_impl;
    local_1e8._M_t.
    super__Tuple_impl<0UL,_duckdb::PartitionWriteInfo_*,_std::default_delete<duckdb::PartitionWriteInfo>_>
    .super__Head_base<0UL,_duckdb::PartitionWriteInfo_*,_false>._M_head_impl =
         (tuple<duckdb::PartitionWriteInfo_*,_std::default_delete<duckdb::PartitionWriteInfo>_>)
         (_Tuple_impl<0UL,_duckdb::PartitionWriteInfo_*,_std::default_delete<duckdb::PartitionWriteInfo>_>
          )0x0;
    ::std::
    _Hashtable<duckdb::vector<duckdb::Value,true>,std::pair<duckdb::vector<duckdb::Value,true>const,duckdb::unique_ptr<duckdb::PartitionWriteInfo,std::default_delete<duckdb::PartitionWriteInfo>,true>>,std::allocator<std::pair<duckdb::vector<duckdb::Value,true>const,duckdb::unique_ptr<duckdb::PartitionWriteInfo,std::default_delete<duckdb::PartitionWriteInfo>,true>>>,std::__detail::_Select1st,duckdb::VectorOfValuesEquality,duckdb::VectorOfValuesHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<std::pair<duckdb::vector<duckdb::Value,true>,duckdb::unique_ptr<duckdb::PartitionWriteInfo,std::default_delete<duckdb::PartitionWriteInfo>,true>>>
              ((_Hashtable<duckdb::vector<duckdb::Value,true>,std::pair<duckdb::vector<duckdb::Value,true>const,duckdb::unique_ptr<duckdb::PartitionWriteInfo,std::default_delete<duckdb::PartitionWriteInfo>,true>>,std::allocator<std::pair<duckdb::vector<duckdb::Value,true>const,duckdb::unique_ptr<duckdb::PartitionWriteInfo,std::default_delete<duckdb::PartitionWriteInfo>,true>>>,std::__detail::_Select1st,duckdb::VectorOfValuesEquality,duckdb::VectorOfValuesHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_180,local_178);
    ::std::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>_>
    ::~unique_ptr((unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>_>
                   *)(local_178 + 0x18));
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_178);
    ::std::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>_>
    ::~unique_ptr((unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>_>
                   *)&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  else {
    pPVar11 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
              ::operator->((unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                            *)((long)iVar10.
                                     super__Node_iterator_base<std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>,_true>
                                     ._M_cur + 0x20));
    pPVar11->active_writes = pPVar11->active_writes + 1;
    pPVar12 = unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
              ::operator*((unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>
                           *)((long)iVar10.
                                    super__Node_iterator_base<std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>,_true>
                                    ._M_cur + 0x20));
  }
  if ((tuple<duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>)local_1c0 !=
      (_Head_base<0UL,_duckdb::StorageLockKey_*,_false>)0x0) {
    StorageLockKey::~StorageLockKey((StorageLockKey *)local_1c0);
    operator_delete((void *)local_1c0);
  }
  return pPVar12;
}

Assistant:

PartitionWriteInfo &GetPartitionWriteInfo(ExecutionContext &context, const PhysicalCopyToFile &op,
	                                          const vector<Value> &values) {
		auto global_lock = lock.GetExclusiveLock();
		// check if we have already started writing this partition
		auto active_write_entry = active_partitioned_writes.find(values);
		if (active_write_entry != active_partitioned_writes.end()) {
			// we have - continue writing in this partition
			active_write_entry->second->active_writes++;
			return *active_write_entry->second;
		}
		// check if we need to close any writers before we can continue
		if (active_partitioned_writes.size() >= max_open_files) {
			// we need to! try to close writers
			for (auto &entry : active_partitioned_writes) {
				if (entry.second->active_writes == 0) {
					// we can evict this entry - evict the partition
					FinalizePartition(context.client, op, *entry.second);
					++previous_partitions[entry.first];
					active_partitioned_writes.erase(entry.first);
					break;
				}
			}
		}
		idx_t offset = 0;
		auto prev_offset = previous_partitions.find(values);
		if (prev_offset != previous_partitions.end()) {
			offset = prev_offset->second;
		}
		auto &fs = FileSystem::GetFileSystem(context.client);
		// Create a writer for the current file
		auto trimmed_path = op.GetTrimmedPath(context.client);
		string hive_path = GetOrCreateDirectory(op.partition_columns, op.names, values, trimmed_path, fs);
		string full_path(op.filename_pattern.CreateFilename(fs, hive_path, op.file_extension, offset));
		if (op.overwrite_mode == CopyOverwriteMode::COPY_APPEND) {
			// when appending, we first check if the file exists
			while (fs.FileExists(full_path)) {
				// file already exists - re-generate name
				if (!op.filename_pattern.HasUUID()) {
					throw InternalException("CopyOverwriteMode::COPY_APPEND without {uuid} - and file exists");
				}
				full_path = op.filename_pattern.CreateFilename(fs, hive_path, op.file_extension, offset);
			}
		}
		optional_ptr<CopyToFileInfo> written_file_info;
		if (op.return_type != CopyFunctionReturnType::CHANGED_ROWS) {
			written_file_info = AddFile(*global_lock, full_path, op.return_type);
		}
		// initialize writes
		auto info = make_uniq<PartitionWriteInfo>();
		info->global_state = op.function.copy_to_initialize_global(context.client, *op.bind_data, full_path);
		if (written_file_info) {
			// set up the file stats for the copy
			op.function.copy_to_get_written_statistics(context.client, *op.bind_data, *info->global_state,
			                                           *written_file_info->file_stats);

			// set the partition info
			vector<Value> partition_keys;
			vector<Value> partition_values;
			for (idx_t i = 0; i < op.partition_columns.size(); i++) {
				const auto &partition_col_name = op.names[op.partition_columns[i]];
				const auto &partition_value = values[i];
				partition_keys.emplace_back(partition_col_name);
				partition_values.push_back(partition_value.DefaultCastAs(LogicalType::VARCHAR));
			}
			written_file_info->partition_keys = Value::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR,
			                                               std::move(partition_keys), std::move(partition_values));
		}
		auto &result = *info;
		info->active_writes = 1;
		// store in active write map
		active_partitioned_writes.insert(make_pair(values, std::move(info)));
		return result;
	}